

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::PrecalculateTileInfo
               (vector<int,_std::allocator<int>_> *num_x_tiles,
               vector<int,_std::allocator<int>_> *num_y_tiles,EXRHeader *exr_header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int max_y;
  int iVar6;
  int iVar7;
  int max_x;
  
  iVar1 = (exr_header->data_window).min_x;
  iVar2 = (exr_header->data_window).min_y;
  iVar3 = (exr_header->data_window).max_x;
  iVar4 = (exr_header->data_window).max_y;
  iVar7 = exr_header->tile_level_mode;
  if (iVar7 == 2) {
    iVar6 = (iVar3 - iVar1) + 1;
LAB_001d5bb9:
    iVar6 = RoundLog2(iVar6,exr_header->tile_rounding_mode);
    iVar6 = iVar6 + 1;
  }
  else {
    if (iVar7 == 1) {
      iVar5 = (iVar3 - iVar1) + 1;
      iVar6 = (iVar4 - iVar2) + 1;
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      goto LAB_001d5bb9;
    }
    iVar6 = 0;
    if (iVar7 == 0) {
      iVar6 = 1;
    }
  }
  if (iVar7 == 2) {
    iVar7 = (iVar4 - iVar2) + 1;
  }
  else {
    if (iVar7 != 1) {
      iVar5 = 0;
      if (iVar7 == 0) {
        iVar5 = 1;
      }
      goto LAB_001d5c0e;
    }
    iVar5 = (iVar3 - iVar1) + 1;
    iVar7 = (iVar4 - iVar2) + 1;
    if (iVar7 < iVar5) {
      iVar7 = iVar5;
    }
  }
  iVar5 = RoundLog2(iVar7,exr_header->tile_rounding_mode);
  iVar5 = iVar5 + 1;
LAB_001d5c0e:
  std::vector<int,_std::allocator<int>_>::resize(num_x_tiles,(long)iVar6);
  std::vector<int,_std::allocator<int>_>::resize(num_y_tiles,(long)iVar5);
  CalculateNumTiles(num_x_tiles,(iVar3 - iVar1) + 1,exr_header->tile_size_x,
                    exr_header->tile_rounding_mode);
  CalculateNumTiles(num_y_tiles,(iVar4 - iVar2) + 1,exr_header->tile_size_y,
                    exr_header->tile_rounding_mode);
  return;
}

Assistant:

static void PrecalculateTileInfo(std::vector<int>& num_x_tiles,
  std::vector<int>& num_y_tiles,
  const EXRHeader* exr_header) {
  int min_x = exr_header->data_window.min_x;
  int max_x = exr_header->data_window.max_x;
  int min_y = exr_header->data_window.min_y;
  int max_y = exr_header->data_window.max_y;

  int num_x_levels = CalculateNumXLevels(exr_header);
  int num_y_levels = CalculateNumYLevels(exr_header);

  num_x_tiles.resize(size_t(num_x_levels));
  num_y_tiles.resize(size_t(num_y_levels));

  CalculateNumTiles(num_x_tiles,
    max_x - min_x + 1,
    exr_header->tile_size_x,
    exr_header->tile_rounding_mode);

  CalculateNumTiles(num_y_tiles,
    max_y - min_y + 1,
    exr_header->tile_size_y,
    exr_header->tile_rounding_mode);
}